

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_proxy_constructor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  JSRefCountHeader *p_1;
  JSValueUnion JVar7;
  JSValueUnion *pJVar8;
  uint uVar9;
  ulong uVar10;
  JSValue val;
  JSValue JVar11;
  JSRefCountHeader *p;
  
  JVar1 = (JSValueUnion)argv->tag;
  JVar2 = (JSValueUnion)argv[1].tag;
  if (JVar2.int32 == -1 && ((ulong)JVar1.ptr & 0xffffffff) == 0xffffffff) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    piVar4 = (int *)argv[1].u.ptr;
    JVar11 = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),0x29);
    JVar7 = JVar11.u;
    if ((JVar11.tag & 0xffffffffU) != 6) {
      pJVar8 = (JSValueUnion *)js_malloc(ctx,0x28);
      uVar9 = (uint)JVar11.tag;
      if (pJVar8 == (JSValueUnion *)0x0) {
        if ((0xfffffff4 < uVar9) && (iVar6 = *JVar7.ptr, *(int *)JVar7.ptr = iVar6 + -1, iVar6 < 2))
        {
          __JS_FreeValueRT(ctx->rt,JVar11);
        }
        goto LAB_001303f0;
      }
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
      pJVar8->ptr = (void *)JVar3;
      pJVar8[1] = JVar1;
      *piVar4 = *piVar4 + 1;
      pJVar8[2].ptr = piVar4;
      pJVar8[3] = JVar2;
      val.tag = (int64_t)JVar1.ptr;
      val.u.ptr = JVar3.ptr;
      iVar6 = JS_IsFunction(ctx,val);
      *(char *)(pJVar8 + 4) = (char)iVar6;
      *(undefined1 *)((long)pJVar8 + 0x21) = 0;
      if (uVar9 == 0xffffffff) {
        *(JSValueUnion **)((long)JVar7.ptr + 0x30) = pJVar8;
      }
      if (JVar1.int32 == -1) {
        bVar5 = *(byte *)((long)JVar3.ptr + 5) & 0x10;
      }
      else {
        bVar5 = 0;
      }
      if (uVar9 == 0xffffffff) {
        *(byte *)((long)JVar7.ptr + 5) = *(byte *)((long)JVar7.ptr + 5) & 0xef | bVar5;
      }
    }
    uVar10 = (ulong)JVar7.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeError(ctx,"not an object",this_val.tag);
LAB_001303f0:
    JVar11 = (JSValue)(ZEXT816(6) << 0x40);
    uVar10 = 0;
  }
  JVar11.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar10);
  return JVar11;
}

Assistant:

static JSValue js_proxy_constructor(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst target, handler;
    JSValue obj;
    JSProxyData *s;

    target = argv[0];
    handler = argv[1];
    if (JS_VALUE_GET_TAG(target) != JS_TAG_OBJECT ||
        JS_VALUE_GET_TAG(handler) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    obj = JS_NewObjectProtoClass(ctx, JS_NULL, JS_CLASS_PROXY);
    if (JS_IsException(obj))
        return obj;
    s = js_malloc(ctx, sizeof(JSProxyData));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->target = JS_DupValue(ctx, target);
    s->handler = JS_DupValue(ctx, handler);
    s->is_func = JS_IsFunction(ctx, target);
    s->is_revoked = FALSE;
    JS_SetOpaque(obj, s);
    JS_SetConstructorBit(ctx, obj, JS_IsConstructor(ctx, target));
    return obj;
}